

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  pointer *pppVar1;
  int32_t node_00;
  pointer ppVar2;
  pointer pNVar3;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  long lVar4;
  real rVar5;
  double dVar6;
  float local_48;
  pair<float,_int> local_38;
  
  local_48 = score;
  while( true ) {
    ppVar2 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3 == (long)k) &&
       (local_48 < ppVar2->first)) {
      return;
    }
    lVar4 = (long)node;
    pNVar3 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pNVar3[lVar4].left == -1) && (pNVar3[lVar4].right == -1)) break;
    rVar5 = Matrix::dotRow((this->wo_).
                           super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           hidden,lVar4 - this->osz_);
    rVar5 = utils::sigmoid(rVar5);
    node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4].left;
    dVar6 = utils::log((double)(ulong)(uint)(1.0 - rVar5));
    dfs(this,k,node_00,SUB84(dVar6,0) + local_48,heap,hidden);
    node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4].right;
    dVar6 = utils::log((double)(ulong)(uint)rVar5);
    local_48 = local_48 + SUB84(dVar6,0);
  }
  local_38.first = local_48;
  local_38.second = node;
  std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
  emplace_back<std::pair<float,int>>
            ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38);
  std::
  push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
            ((heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish,comparePairs);
  __first._M_current =
       (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
    std::
    pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
              (__first,__last,comparePairs);
    pppVar1 = &(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + -1;
  }
  return;
}

Assistant:

void Model::dfs(int32_t k, int32_t node, real score,
                std::vector<std::pair<real, int32_t>>& heap,
                Vector& hidden) const {
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree[node].left == -1 && tree[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = utils::sigmoid(wo_->dotRow(hidden, node - osz_));
  dfs(k, tree[node].left, score + utils::log(1.0 - f), heap, hidden);
  dfs(k, tree[node].right, score + utils::log(f), heap, hidden);
}